

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

string * cmake::FindCacheFile(string *__return_storage_ptr__,string *binaryDir)

{
  bool bVar1;
  ulong uVar2;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  undefined1 local_150 [8];
  string cachePathFound;
  cmAlphaNum local_100;
  undefined1 local_d0 [8];
  string cmakeFiles;
  cmAlphaNum local_80;
  undefined1 local_50 [8];
  string cacheFile;
  string *binaryDir_local;
  string *cachePath;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)binaryDir);
  cmsys::SystemTools::ConvertToUnixSlashes(__return_storage_ptr__);
  cmAlphaNum::cmAlphaNum(&local_80,__return_storage_ptr__);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&cmakeFiles.field_2 + 8),"/CMakeCache.txt");
  cmStrCat<>((string *)local_50,&local_80,(cmAlphaNum *)((long)&cmakeFiles.field_2 + 8));
  bVar1 = cmsys::SystemTools::FileExists((string *)local_50);
  if (!bVar1) {
    cmAlphaNum::cmAlphaNum(&local_100,__return_storage_ptr__);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&cachePathFound.field_2 + 8),"/CMakeFiles");
    cmStrCat<>((string *)local_d0,&local_100,(cmAlphaNum *)((long)&cachePathFound.field_2 + 8));
    bVar1 = cmsys::SystemTools::FileExists((string *)local_d0);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"CMakeCache.txt",&local_171);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"/",&local_199);
      cmSystemTools::FileExistsInParentDirectories
                ((string *)local_150,&local_170,__return_storage_ptr__,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator(&local_199);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator(&local_171);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        cmsys::SystemTools::GetFilenamePath(&local_1c0,(string *)local_150);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
      }
      std::__cxx11::string::~string((string *)local_150);
    }
    std::__cxx11::string::~string((string *)local_d0);
  }
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::FindCacheFile(const std::string& binaryDir)
{
  std::string cachePath = binaryDir;
  cmSystemTools::ConvertToUnixSlashes(cachePath);
  std::string cacheFile = cmStrCat(cachePath, "/CMakeCache.txt");
  if (!cmSystemTools::FileExists(cacheFile)) {
    // search in parent directories for cache
    std::string cmakeFiles = cmStrCat(cachePath, "/CMakeFiles");
    if (cmSystemTools::FileExists(cmakeFiles)) {
      std::string cachePathFound =
        cmSystemTools::FileExistsInParentDirectories("CMakeCache.txt",
                                                     cachePath, "/");
      if (!cachePathFound.empty()) {
        cachePath = cmSystemTools::GetFilenamePath(cachePathFound);
      }
    }
  }
  return cachePath;
}